

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

void cmdline_run_saved(Conf *conf)

{
  ulong local_20;
  size_t i;
  size_t pri;
  Conf *conf_local;
  
  for (i = 0; i < 2; i = i + 1) {
    for (local_20 = 0; local_20 < saves[i].nsaved; local_20 = local_20 + 1) {
      cmdline_process_param(saves[i].params[local_20].p,saves[i].params[local_20].value,0,conf);
      safefree(saves[i].params[local_20].p);
      safefree(saves[i].params[local_20].value);
    }
    saves[i].nsaved = 0;
  }
  return;
}

Assistant:

void cmdline_run_saved(Conf *conf)
{
    for (size_t pri = 0; pri < NPRIORITIES; pri++) {
        for (size_t i = 0; i < saves[pri].nsaved; i++) {
            cmdline_process_param(saves[pri].params[i].p,
                                  saves[pri].params[i].value, 0, conf);
            sfree(saves[pri].params[i].p);
            sfree(saves[pri].params[i].value);
        }
        saves[pri].nsaved = 0;
    }
}